

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O2

string * __thiscall
test_pad_reflect_1d::vars_abi_cxx11_(string *__return_storage_ptr__,test_pad_reflect_1d *this)

{
  string sStack_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  var_to_str_abi_cxx11_(&local_38,this->type);
  std::operator+(&local_f8,"type=",&local_38);
  std::operator+(&local_d8,&local_f8,",");
  var_to_str<long,4ul>(&local_138,&this->ne_a);
  std::operator+(&local_118,"ne_a=",&local_138);
  std::operator+(&local_b8,&local_d8,&local_118);
  std::operator+(&local_98,&local_b8,",");
  var_to_str<int>(&local_178,&this->pad_0);
  std::operator+(&local_158,"pad_0=",&local_178);
  std::operator+(&local_78,&local_98,&local_158);
  std::operator+(&local_58,&local_78,",");
  var_to_str<int>(&sStack_1b8,&this->pad_1);
  std::operator+(&local_198,"pad_1=",&sStack_1b8);
  std::operator+(__return_storage_ptr__,&local_58,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&sStack_1b8);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string vars() override {
        return VARS_TO_STR4(type, ne_a, pad_0, pad_1);
    }